

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

int __thiscall Poller::Mod(Poller *this,PollObj *po,int op)

{
  int __epfd;
  int __fd;
  uint32_t local_24;
  PollObj *local_20;
  
  local_24 = (op & 1U) + (op & 2U) * 2 + (op & 0xfffffff0U) * 0x8000000 + 0x2018;
  __epfd = this->context->epollfd;
  local_20 = po;
  __fd = (*po->_vptr_PollObj[2])(po);
  epoll_ctl(__epfd,3,__fd,(epoll_event *)&local_24);
  return 0;
}

Assistant:

int Poller::Mod(PollObj* po, int op) {
    struct epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    ev.data.ptr = (void*)(po);
    ev.events |= EPOLLERR | EPOLLHUP | EPOLLRDHUP;
    if(op & EV_READ)
        ev.events |= EPOLLIN;
    if(op & EV_WRITE)
        ev.events |= EPOLLOUT;
    if(op & EV_ET)
        ev.events |= EPOLLET;
    epoll_ctl(context->epollfd, EPOLL_CTL_MOD, po->GetSockFd(), &ev);

    return 0;
}